

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassDeserializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  FieldDescriptor *this_00;
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  Type TVar5;
  GeneratorOptions *pGVar6;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  AlphaNum *a;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *pFVar9;
  FieldDescriptor *field_00;
  AlphaNum *a_00;
  FieldDescriptor *field_01;
  undefined1 in_R9B;
  undefined1 drop_list;
  char **args_3;
  undefined1 in_stack_fffffffffffffc18;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  byte local_213;
  allocator local_212;
  byte local_211;
  AlphaNum local_210;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  char *local_1a0;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  GeneratorOptions *local_98;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  AlphaNum local_78;
  string local_48;
  GeneratorOptions *local_28;
  FieldDescriptor *field_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_28 = (GeneratorOptions *)field;
  field_local = (FieldDescriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  iVar3 = FieldDescriptor::number(field);
  strings::AlphaNum::AlphaNum(&local_78,iVar3);
  psVar7 = &local_48;
  StrCat_abi_cxx11_(psVar7,(protobuf *)&local_78,a);
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer,"    case $num$:\n",(char (*) [4])0x778734,psVar7);
  std::__cxx11::string::~string((string *)&local_48);
  bVar2 = FieldDescriptor::is_map((FieldDescriptor *)local_28);
  if (bVar2) {
    value_field = anon_unknown_0::MapFieldKey((FieldDescriptor *)local_28);
    local_98 = (GeneratorOptions *)anon_unknown_0::MapFieldValue((FieldDescriptor *)local_28);
    pFVar9 = field_local;
    psVar7 = &local_b8;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (psVar7,(_anonymous_namespace_ *)printer_local,local_28,(FieldDescriptor *)0x0,
               BYTES_DEFAULT,(bool)in_R9B);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar9,
               "      var value = msg.get$name$();\n      reader.readMessage(value, function(message, reader) {\n"
               ,(char (*) [5])0x77db8d,psVar7);
    std::__cxx11::string::~string((string *)&local_b8);
    pFVar9 = field_local;
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              (&local_d8,(_anonymous_namespace_ *)printer_local,(GeneratorOptions *)value_field,
               (FieldDescriptor *)psVar7);
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              (&local_f8,(_anonymous_namespace_ *)printer_local,local_98,(FieldDescriptor *)psVar7);
    pbVar8 = &local_d8;
    io::Printer::Print<char[12],std::__cxx11::string,char[14],std::__cxx11::string>
              ((Printer *)pFVar9,
               "        jspb.Map.deserializeBinary(message, reader, $keyReaderFn$, $valueReaderFn$",
               (char (*) [12])"keyReaderFn",pbVar8,(char (*) [14])"valueReaderFn",&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    TVar5 = FieldDescriptor::type((FieldDescriptor *)local_98);
    pPVar1 = printer_local;
    pFVar9 = field_local;
    if (TVar5 == TYPE_MESSAGE) {
      pGVar6 = (GeneratorOptions *)FieldDescriptor::message_type((FieldDescriptor *)local_98);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&local_118,(_anonymous_namespace_ *)pPVar1,pGVar6,(Descriptor *)pbVar8);
      io::Printer::Print<char[12],std::__cxx11::string>
                ((Printer *)pFVar9,", $messageType$.deserializeBinaryFromReader",
                 (char (*) [12])"messageType",&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      pFVar9 = extraout_RDX;
    }
    else {
      io::Printer::Print<>((Printer *)field_local,", null");
      pFVar9 = extraout_RDX_00;
    }
    this_00 = field_local;
    psVar7 = &local_138;
    (anonymous_namespace)::JSFieldDefault_abi_cxx11_
              (psVar7,(_anonymous_namespace_ *)value_field,pFVar9);
    io::Printer::Print<char[11],std::__cxx11::string>
              ((Printer *)this_00,", $defaultKey$",(char (*) [11])"defaultKey",psVar7);
    std::__cxx11::string::~string((string *)&local_138);
    TVar5 = FieldDescriptor::type((FieldDescriptor *)local_98);
    pPVar1 = printer_local;
    pFVar9 = field_local;
    if (TVar5 == TYPE_MESSAGE) {
      pGVar6 = (GeneratorOptions *)FieldDescriptor::message_type((FieldDescriptor *)local_98);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&local_158,(_anonymous_namespace_ *)pPVar1,pGVar6,(Descriptor *)psVar7);
      io::Printer::Print<char[12],std::__cxx11::string>
                ((Printer *)pFVar9,", new $messageType$()",(char (*) [12])"messageType",&local_158);
      std::__cxx11::string::~string((string *)&local_158);
    }
    else {
      (anonymous_namespace)::JSFieldDefault_abi_cxx11_
                (&local_178,(_anonymous_namespace_ *)local_98,field_00);
      io::Printer::Print<char[13],std::__cxx11::string>
                ((Printer *)pFVar9,", $defaultValue$",(char (*) [13])"defaultValue",&local_178);
      std::__cxx11::string::~string((string *)&local_178);
    }
    io::Printer::Print<>((Printer *)field_local,");\n");
    io::Printer::Print<>((Printer *)field_local,"         });\n");
  }
  else {
    CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)local_28);
    pFVar9 = field_local;
    if (CVar4 == CPPTYPE_MESSAGE) {
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (&local_198,(_anonymous_namespace_ *)printer_local,local_28,
                 (FieldDescriptor *)psVar7);
      TVar5 = FieldDescriptor::type((FieldDescriptor *)local_28);
      local_1a0 = "jspb.Message";
      if (TVar5 == TYPE_GROUP) {
        local_1a0 = "msgOrGroup";
      }
      local_1a0 = local_1a0 + 5;
      local_211 = 0;
      local_213 = 0;
      TVar5 = FieldDescriptor::type((FieldDescriptor *)local_28);
      if (TVar5 == TYPE_GROUP) {
        iVar3 = FieldDescriptor::number((FieldDescriptor *)local_28);
        strings::AlphaNum::AlphaNum(&local_210,iVar3);
        StrCat_abi_cxx11_(&local_1e0,(protobuf *)&local_210,a_00);
        local_211 = 1;
        std::operator+(&local_1c0,&local_1e0,", ");
      }
      else {
        std::allocator<char>::allocator();
        local_213 = 1;
        std::__cxx11::string::string((string *)&local_1c0,"",&local_212);
      }
      args_3 = &local_1a0;
      io::Printer::
      Print<char[11],std::__cxx11::string,char[11],char_const*,char[9],std::__cxx11::string>
                ((Printer *)pFVar9,
                 "      var value = new $fieldclass$;\n      reader.read$msgOrGroup$($grpfield$value,$fieldclass$.deserializeBinaryFromReader);\n"
                 ,(char (*) [11])"fieldclass",&local_198,(char (*) [11])"msgOrGroup",args_3,
                 (char (*) [9])"grpfield",&local_1c0);
      drop_list = SUB81(args_3,0);
      std::__cxx11::string::~string((string *)&local_1c0);
      if ((local_213 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_212);
      }
      if ((local_211 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1e0);
      }
      std::__cxx11::string::~string((string *)&local_198);
    }
    else {
      bVar2 = FieldDescriptor::is_packable((FieldDescriptor *)local_28);
      pFVar9 = field_local;
      if (bVar2) {
        (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                  (&local_238,(_anonymous_namespace_ *)printer_local,local_28,(FieldDescriptor *)0x0
                   ,true,false,true,BYTES_DEFAULT,(bool)in_stack_fffffffffffffc18);
        (anonymous_namespace)::JSBinaryReaderMethodType_abi_cxx11_
                  (&local_258,(_anonymous_namespace_ *)local_28,field_01);
        pbVar8 = &local_258;
        io::Printer::Print<char[10],std::__cxx11::string,char[7],std::__cxx11::string>
                  ((Printer *)pFVar9,
                   "      var values = /** @type {$fieldtype$} */ (reader.isDelimited() ? reader.readPacked$reader$() : [reader.read$reader$()]);\n"
                   ,(char (*) [10])"fieldtype",&local_238,(char (*) [7])0x7a32a2,pbVar8);
        drop_list = SUB81(pbVar8,0);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_238);
      }
      else {
        bVar2 = false;
        (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                  (&local_278,(_anonymous_namespace_ *)printer_local,local_28,(FieldDescriptor *)0x0
                   ,true,true,true,BYTES_DEFAULT,(bool)in_stack_fffffffffffffc18);
        (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
                  (&local_298,(_anonymous_namespace_ *)local_28,(FieldDescriptor *)0x0,bVar2);
        pbVar8 = &local_298;
        io::Printer::Print<char[10],std::__cxx11::string,char[7],std::__cxx11::string>
                  ((Printer *)pFVar9,
                   "      var value = /** @type {$fieldtype$} */ (reader.read$reader$());\n",
                   (char (*) [10])"fieldtype",&local_278,(char (*) [7])0x7a32a2,pbVar8);
        drop_list = SUB81(pbVar8,0);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_278);
      }
    }
    bVar2 = FieldDescriptor::is_packable((FieldDescriptor *)local_28);
    pFVar9 = field_local;
    if (bVar2) {
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&local_2b8,(_anonymous_namespace_ *)printer_local,local_28,(FieldDescriptor *)0x0,
                 BYTES_B64,(bool)drop_list);
      io::Printer::Print<char[5],std::__cxx11::string>
                ((Printer *)pFVar9,
                 "      for (var i = 0; i < values.length; i++) {\n        msg.add$name$(values[i]);\n      }\n"
                 ,(char (*) [5])0x77db8d,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    else {
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)local_28);
      pFVar9 = field_local;
      if (bVar2) {
        (anonymous_namespace)::JSGetterName_abi_cxx11_
                  (&local_2d8,(_anonymous_namespace_ *)printer_local,local_28,(FieldDescriptor *)0x0
                   ,BYTES_B64,(bool)drop_list);
        io::Printer::Print<char[5],std::__cxx11::string>
                  ((Printer *)pFVar9,"      msg.add$name$(value);\n",(char (*) [5])0x77db8d,
                   &local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
      else {
        (anonymous_namespace)::JSGetterName_abi_cxx11_
                  (&local_2f8,(_anonymous_namespace_ *)printer_local,local_28,(FieldDescriptor *)0x0
                   ,BYTES_DEFAULT,(bool)drop_list);
        io::Printer::Print<char[5],std::__cxx11::string>
                  ((Printer *)pFVar9,"      msg.set$name$(value);\n",(char (*) [5])0x77db8d,
                   &local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
      }
    }
  }
  io::Printer::Print<>((Printer *)field_local,"      break;\n");
  return;
}

Assistant:

void Generator::GenerateClassDeserializeBinaryField(
    const GeneratorOptions& options, io::Printer* printer,
    const FieldDescriptor* field) const {
  printer->Print("    case $num$:\n", "num", StrCat(field->number()));

  if (field->is_map()) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "      var value = msg.get$name$();\n"
        "      reader.readMessage(value, function(message, reader) {\n",
        "name", JSGetterName(options, field));

    printer->Print(
        "        jspb.Map.deserializeBinary(message, reader, "
        "$keyReaderFn$, $valueReaderFn$",
        "keyReaderFn", JSBinaryReaderMethodName(options, key_field),
        "valueReaderFn", JSBinaryReaderMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.deserializeBinaryFromReader",
                     "messageType",
                     GetMessagePath(options, value_field->message_type()));
    } else {
      printer->Print(", null");
    }
    printer->Print(", $defaultKey$", "defaultKey", JSFieldDefault(key_field));
    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", new $messageType$()", "messageType",
                     GetMessagePath(options, value_field->message_type()));
    } else {
      printer->Print(", $defaultValue$", "defaultValue",
                     JSFieldDefault(value_field));
    }
    printer->Print(");\n");
    printer->Print("         });\n");
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          "      var value = new $fieldclass$;\n"
          "      reader.read$msgOrGroup$($grpfield$value,"
          "$fieldclass$.deserializeBinaryFromReader);\n",
          "fieldclass", SubmessageTypeRef(options, field), "msgOrGroup",
          (field->type() == FieldDescriptor::TYPE_GROUP) ? "Group" : "Message",
          "grpfield",
          (field->type() == FieldDescriptor::TYPE_GROUP)
              ? (StrCat(field->number()) + ", ")
              : "");
    } else if (field->is_packable()) {
      printer->Print(
          "      var values = /** @type {$fieldtype$} */ "
          "(reader.isDelimited() "
          "? reader.readPacked$reader$() : [reader.read$reader$()]);\n",
          "fieldtype",
          JSFieldTypeAnnotation(options, field, false, true,
                                /* singular_if_not_packed */ false, BYTES_U8),
          "reader", JSBinaryReaderMethodType(field));
    } else {
      printer->Print(
          "      var value = /** @type {$fieldtype$} */ "
          "(reader.read$reader$());\n",
          "fieldtype",
          JSFieldTypeAnnotation(options, field, false, true,
                                /* singular_if_not_packed */ true, BYTES_U8),
          "reader",
          JSBinaryReadWriteMethodName(field, /* is_writer = */ false));
    }

    if (field->is_packable()) {
      printer->Print(
          "      for (var i = 0; i < values.length; i++) {\n"
          "        msg.add$name$(values[i]);\n"
          "      }\n",
          "name",
          JSGetterName(options, field, BYTES_DEFAULT, /* drop_list = */ true));
    } else if (field->is_repeated()) {
      printer->Print(
          "      msg.add$name$(value);\n", "name",
          JSGetterName(options, field, BYTES_DEFAULT, /* drop_list = */ true));
    } else {
      // Singular fields, and packed repeated fields, receive a |value| either
      // as the field's value or as the array of all the field's values; set
      // this as the field's value directly.
      printer->Print("      msg.set$name$(value);\n", "name",
                     JSGetterName(options, field));
    }
  }

  printer->Print("      break;\n");
}